

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O1

void Saig_ManCexMinGetCos(Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Int_t *vLeaves,Vec_Int_t *vRoots)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  
  vRoots->nSize = 0;
  if (vLeaves == (Vec_Int_t *)0x0) {
    iVar1 = pCex->iPo;
    if ((-1 < (long)iVar1) && (iVar1 < pAig->vCos->nSize)) {
      Vec_IntPush(vRoots,*(int *)((long)pAig->vCos->pArray[iVar1] + 0x24));
      return;
    }
LAB_004fedda:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (0 < vLeaves->nSize) {
    lVar5 = 0;
    do {
      pVVar2 = pAig->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        piVar4 = (int *)0x0;
      }
      else {
        uVar3 = vLeaves->pArray[lVar5];
        if (((int)uVar3 < 0) || (pVVar2->nSize <= (int)uVar3)) goto LAB_004fedda;
        piVar4 = (int *)pVVar2->pArray[uVar3];
      }
      if ((((uint)*(undefined8 *)(piVar4 + 6) & 7) == 2) && (pAig->nTruePis <= *piVar4)) {
        if (*piVar4 < pAig->nTruePis) {
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        uVar3 = (*piVar4 - pAig->nTruePis) + pAig->nTruePos;
        if (((int)uVar3 < 0) || (pAig->vCos->nSize <= (int)uVar3)) goto LAB_004fedda;
        Vec_IntPush(vRoots,*(int *)((long)pAig->vCos->pArray[uVar3] + 0x24));
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vLeaves->nSize);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the roots to begin traversal.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_ManCexMinGetCos( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Int_t * vLeaves, Vec_Int_t * vRoots )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_IntClear( vRoots );
    if ( vLeaves == NULL )
    {
        pObj = Aig_ManCo( pAig, pCex->iPo );
        Vec_IntPush( vRoots, Aig_ObjId(pObj) );
        return;
    }
    Aig_ManForEachObjVec( vLeaves, pAig, pObj, i )
        if ( Saig_ObjIsLo(pAig, pObj) )
            Vec_IntPush( vRoots, Aig_ObjId( Saig_ObjLoToLi(pAig, pObj) ) );
}